

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O1

void __thiscall
kratos::StmtException::
print_nodes<__gnu_cxx::__normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>>
          (StmtException *this,
          __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
          begin,__normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
                end)

{
  if (begin._M_current != end._M_current) {
    do {
      print_ast_node(&(*begin._M_current)->super_IRNode);
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != end._M_current);
  }
  return;
}

Assistant:

void StmtException::print_nodes(T begin, T end) noexcept {
    for (auto it = begin; it != end; it++) {
        print_ast_node(*it);
    }
}